

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string_view classname,
          NameEquality equality_mode)

{
  ushort *puVar1;
  bool bVar2;
  NameEquality NVar3;
  long lVar4;
  bool bVar5;
  long lVar6;
  NameEquality equality_mode_00;
  string_view classname_00;
  string_view classname_01;
  string_view a;
  string_view a_00;
  string_view a_01;
  string_view a_02;
  
  bVar5 = 0 < file->enum_type_count_;
  equality_mode_00 = equality_mode;
  if (0 < file->enum_type_count_) {
    puVar1 = (ushort *)(file->enum_types_->all_names_).payload_;
    a._M_len = (ulong)*puVar1;
    a._M_str = (char *)((long)puVar1 + ~a._M_len);
    NVar3 = java::anon_unknown_0::CheckNameEquality(a,classname);
    if (NVar3 != equality_mode) {
      lVar6 = 0x60;
      lVar4 = 0;
      do {
        lVar4 = lVar4 + 1;
        bVar5 = lVar4 < file->enum_type_count_;
        if (file->enum_type_count_ <= lVar4) goto LAB_001c6c95;
        puVar1 = *(ushort **)(&file->enum_types_->super_SymbolBase + lVar6);
        lVar6 = lVar6 + 0x58;
        a_00._M_len = (ulong)*puVar1;
        a_00._M_str = (char *)(~a_00._M_len + (long)puVar1);
        NVar3 = java::anon_unknown_0::CheckNameEquality(a_00,classname);
      } while (NVar3 != equality_mode);
    }
    if (bVar5) {
      return true;
    }
  }
LAB_001c6c95:
  bVar5 = 0 < file->service_count_;
  if (0 < file->service_count_) {
    puVar1 = (ushort *)(file->services_->all_names_).payload_;
    a_01._M_len = (ulong)*puVar1;
    a_01._M_str = (char *)((long)puVar1 + ~a_01._M_len);
    NVar3 = java::anon_unknown_0::CheckNameEquality(a_01,classname);
    if (NVar3 != equality_mode) {
      lVar6 = 0x48;
      lVar4 = 0;
      do {
        lVar4 = lVar4 + 1;
        bVar5 = lVar4 < file->service_count_;
        if (file->service_count_ <= lVar4) goto LAB_001c6d11;
        puVar1 = *(ushort **)(&file->services_->super_SymbolBase + lVar6);
        lVar6 = lVar6 + 0x40;
        a_02._M_len = (ulong)*puVar1;
        a_02._M_str = (char *)(~a_02._M_len + (long)puVar1);
        NVar3 = java::anon_unknown_0::CheckNameEquality(a_02,classname);
      } while (NVar3 != equality_mode);
    }
    if (bVar5) {
      return true;
    }
  }
LAB_001c6d11:
  bVar5 = 0 < file->message_type_count_;
  if ((0 < file->message_type_count_) &&
     (classname_00._M_str._0_4_ = equality_mode, classname_00._M_len = (size_t)classname._M_str,
     classname_00._M_str._4_4_ = 0,
     bVar2 = java::anon_unknown_0::MessageHasConflictingClassName
                       ((anon_unknown_0 *)file->message_types_,(Descriptor *)classname._M_len,
                        classname_00,equality_mode_00), !bVar2)) {
    lVar6 = 0;
    lVar4 = 0xa0;
    do {
      lVar6 = lVar6 + 1;
      bVar5 = lVar6 < file->message_type_count_;
      if (file->message_type_count_ <= lVar6) {
        return bVar5;
      }
      classname_01._M_str._0_4_ = equality_mode;
      classname_01._M_len = (size_t)classname._M_str;
      classname_01._M_str._4_4_ = 0;
      bVar2 = java::anon_unknown_0::MessageHasConflictingClassName
                        ((anon_unknown_0 *)(&file->message_types_->super_SymbolBase + lVar4),
                         (Descriptor *)classname._M_len,classname_01,equality_mode_00);
      lVar4 = lVar4 + 0xa0;
    } while (!bVar2);
  }
  return bVar5;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(const FileDescriptor* file,
                                                absl::string_view classname,
                                                NameEquality equality_mode) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (CheckNameEquality(file->enum_type(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (CheckNameEquality(file->service(i)->name(), classname) ==
        equality_mode) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname,
                                       equality_mode)) {
      return true;
    }
  }
  return false;
}